

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_test.cpp
# Opt level: O0

void __thiscall Image_GetSetBGR_Test::TestBody(Image_GetSetBGR_Test *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v_00;
  Point2i p;
  WrapMode2D wrapMode;
  Point2i p_00;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  Point2i p_01;
  Point2i resolution;
  undefined1 uVar1;
  bool bVar2;
  int *piVar3;
  reference val1;
  reference val2;
  reference pvVar4;
  char *pcVar5;
  int iVar6;
  AssertionResult gtest_ar_6;
  Float qv;
  AssertionResult gtest_ar_5;
  int offset;
  AssertionResult gtest_ar_4;
  int c_1;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  ImageChannelValues bgr;
  AssertionResult gtest_ar;
  ImageChannelValues rgb;
  int x_1;
  int y_1;
  AssertionResult gtest_ar_;
  ImageChannelDesc bgrDesc;
  int c;
  int x;
  int y;
  Image image;
  PixelFormat format;
  const_iterator __end1;
  const_iterator __begin1;
  initializer_list<pbrt::PixelFormat> *__range1;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> rgbPixels;
  Point2i res;
  ColorEncodingHandle *in_stack_fffffffffffff8a8;
  Image *in_stack_fffffffffffff8b0;
  undefined4 in_stack_fffffffffffff8b8;
  WrapMode in_stack_fffffffffffff8bc;
  WrapMode2D *in_stack_fffffffffffff8c0;
  undefined4 in_stack_fffffffffffff8c8;
  Float in_stack_fffffffffffff8cc;
  reference in_stack_fffffffffffff8d0;
  char *in_stack_fffffffffffff8d8;
  undefined4 in_stack_fffffffffffff8e0;
  float in_stack_fffffffffffff8e4;
  float in_stack_fffffffffffff8e8;
  value_type_conflict1 in_stack_fffffffffffff8ec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff8f0;
  char *in_stack_fffffffffffff910;
  undefined7 in_stack_fffffffffffff918;
  undefined1 in_stack_fffffffffffff91f;
  Float in_stack_fffffffffffff920;
  int in_stack_fffffffffffff924;
  Image *in_stack_fffffffffffff928;
  int in_stack_fffffffffffff930;
  WrapMode in_stack_fffffffffffff934;
  WrapMode in_stack_fffffffffffff938;
  int in_stack_fffffffffffff93c;
  int iVar7;
  int in_stack_fffffffffffff944;
  Tuple2<pbrt::Point2,_int> in_stack_fffffffffffff948;
  char *in_stack_fffffffffffff970;
  undefined7 in_stack_fffffffffffff978;
  Image *in_stack_fffffffffffff988;
  char *in_stack_fffffffffffff990;
  undefined7 in_stack_fffffffffffff998;
  undefined1 in_stack_fffffffffffff99f;
  array<pbrt::WrapMode,_2> in_stack_fffffffffffff9a0;
  int in_stack_fffffffffffff9a8;
  ColorEncodingHandle *in_stack_fffffffffffff9c0;
  PixelFormat in_stack_fffffffffffff9cc;
  Image *in_stack_fffffffffffff9d0;
  Allocator in_stack_fffffffffffff9d8;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff9e0;
  undefined6 in_stack_fffffffffffff9f0;
  undefined1 in_stack_fffffffffffff9f6;
  undefined1 in_stack_fffffffffffff9f7;
  string *desc;
  Image *this_00;
  array<pbrt::WrapMode,_2> wrapMode_00;
  Tuple2<pbrt::Point2,_int> p_02;
  string *local_550;
  AssertionResult local_500;
  Float local_4ec;
  undefined4 local_4d8;
  float local_4d4;
  AssertionResult local_4d0;
  int local_4bc;
  Float local_494;
  AssertionResult local_490;
  int local_47c;
  AssertionResult local_468 [2];
  AssertionResult local_448 [2];
  AssertionResult local_428 [6];
  WrapMode local_3c8 [2];
  undefined4 local_3bc;
  AssertionResult local_3b8 [2];
  InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> local_398;
  int local_368;
  int local_364;
  string local_360 [48];
  AssertionResult local_330;
  undefined1 local_31c;
  allocator<char> local_31b;
  allocator<char> local_31a;
  allocator<char> local_319;
  WrapMode local_318 [2];
  ImageChannelDesc local_310;
  undefined1 local_2d0 [32];
  ImageChannelDesc *local_2b0;
  undefined8 local_2a8;
  int local_254;
  int local_250;
  int local_24c;
  ColorEncodingHandle *local_248;
  undefined1 local_237;
  allocator<char> local_236;
  allocator<char> local_235 [20];
  allocator<char> local_221;
  memory_resource *local_220;
  memory_resource local_218 [4];
  undefined1 local_1f8 [32];
  undefined1 local_1d8 [32];
  memory_resource *local_1b8;
  undefined8 local_1b0;
  Tuple2<pbrt::Point2,_int> local_198;
  PixelFormat local_74;
  const_iterator local_70;
  const_iterator local_68;
  PixelFormat local_5c [3];
  initializer_list<pbrt::PixelFormat> local_50;
  initializer_list<pbrt::PixelFormat> *local_40;
  Tuple2<pbrt::Point2,_int> local_38;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_30;
  Tuple2<pbrt::Point2,_int> local_10 [2];
  
  pbrt::Point2<int>::Point2
            ((Point2<int> *)in_stack_fffffffffffff8b0,
             (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20),(int)in_stack_fffffffffffff8a8);
  local_38 = local_10[0];
  GetFloatPixels((Point2i)in_stack_fffffffffffff948,in_stack_fffffffffffff944);
  local_5c[0] = U256;
  local_5c[1] = 1;
  local_5c[2] = 2;
  local_50._M_array = local_5c;
  local_50._M_len = 3;
  local_40 = &local_50;
  local_68 = std::initializer_list<pbrt::PixelFormat>::begin(local_40);
  local_70 = std::initializer_list<pbrt::PixelFormat>::end
                       ((initializer_list<pbrt::PixelFormat> *)in_stack_fffffffffffff8b0);
  for (; local_68 != local_70; local_68 = local_68 + 1) {
    local_74 = *local_68;
    local_198 = local_10[0];
    local_237 = 1;
    local_220 = local_218;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff8f0,
               (char *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
               (allocator<char> *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
    local_220 = (memory_resource *)local_1f8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff8f0,
               (char *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
               (allocator<char> *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
    local_220 = (memory_resource *)local_1d8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff8f0,
               (char *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
               (allocator<char> *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
    local_237 = 0;
    local_1b8 = local_218;
    local_1b0 = 3;
    v._M_array._4_4_ = in_stack_fffffffffffff8bc;
    v._M_array._0_4_ = in_stack_fffffffffffff8b8;
    v._M_len = (size_type)in_stack_fffffffffffff8c0;
    pstd::
    span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    span((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)in_stack_fffffffffffff8b0,v);
    pbrt::ColorEncodingHandle::ColorEncodingHandle
              ((ColorEncodingHandle *)in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8);
    pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
              ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffff8b0);
    resolution.super_Tuple2<pbrt::Point2,_int>.y._2_1_ = in_stack_fffffffffffff9f6;
    resolution.super_Tuple2<pbrt::Point2,_int>._0_6_ = in_stack_fffffffffffff9f0;
    resolution.super_Tuple2<pbrt::Point2,_int>.y._3_1_ = in_stack_fffffffffffff9f7;
    in_stack_fffffffffffff8a8 = local_248;
    pbrt::Image::Image(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9cc,resolution,
                       in_stack_fffffffffffff9e0,in_stack_fffffffffffff9c0,in_stack_fffffffffffff9d8
                      );
    local_550 = (string *)&local_1b8;
    do {
      local_550 = local_550 + -0x20;
      std::__cxx11::string::~string(local_550);
    } while (local_550 != (string *)local_218);
    std::allocator<char>::~allocator(&local_236);
    std::allocator<char>::~allocator(local_235);
    std::allocator<char>::~allocator(&local_221);
    for (local_24c = 0; iVar7 = local_24c,
        piVar3 = pbrt::Tuple2<pbrt::Point2,_int>::operator[](local_10,1), iVar7 < *piVar3;
        local_24c = local_24c + 1) {
      for (local_250 = 0; iVar7 = local_250,
          piVar3 = pbrt::Tuple2<pbrt::Point2,_int>::operator[](local_10,0), iVar7 < *piVar3;
          local_250 = local_250 + 1) {
        for (local_254 = 0; local_254 < 3; local_254 = local_254 + 1) {
          pbrt::Point2<int>::Point2
                    ((Point2<int> *)in_stack_fffffffffffff8b0,
                     (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20),(int)in_stack_fffffffffffff8a8)
          ;
          iVar7 = local_24c * 3;
          piVar3 = pbrt::Tuple2<pbrt::Point2,_int>::operator[](local_10,0);
          pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                    (&local_30,(long)(iVar7 * *piVar3 + local_250 * 3 + local_254));
          p.super_Tuple2<pbrt::Point2,_int>.y = in_stack_fffffffffffff934;
          p.super_Tuple2<pbrt::Point2,_int>.x = in_stack_fffffffffffff930;
          pbrt::Image::SetChannel
                    (in_stack_fffffffffffff928,p,in_stack_fffffffffffff924,in_stack_fffffffffffff920
                    );
        }
      }
    }
    local_31c = 1;
    local_318 = (WrapMode  [2])&local_310;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff8f0,
               (char *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
               (allocator<char> *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
    local_318 = (WrapMode  [2])&local_310.offset.nAlloc;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff8f0,
               (char *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
               (allocator<char> *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
    wrapMode_00.values = (WrapMode  [2])local_2d0;
    p_02 = (Tuple2<pbrt::Point2,_int>)&local_31b;
    local_318 = wrapMode_00.values;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff8f0,
               (char *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
               (allocator<char> *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
    local_31c = 0;
    local_2b0 = &local_310;
    local_2a8 = 3;
    v_00._M_array._4_4_ = in_stack_fffffffffffff8bc;
    v_00._M_array._0_4_ = in_stack_fffffffffffff8b8;
    v_00._M_len = (size_type)in_stack_fffffffffffff8c0;
    pstd::
    span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    span((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)in_stack_fffffffffffff8b0,v_00);
    requestedChannels.n._0_7_ = in_stack_fffffffffffff998;
    requestedChannels.ptr =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         in_stack_fffffffffffff990;
    requestedChannels.n._7_1_ = in_stack_fffffffffffff99f;
    pbrt::Image::GetChannelDesc(in_stack_fffffffffffff988,requestedChannels);
    desc = (string *)&local_310;
    this_00 = (Image *)(local_2d0 + 0x20);
    do {
      this_00 = (Image *)((long)this_00 + -0x20);
      std::__cxx11::string::~string((string *)this_00);
    } while (this_00 != (Image *)desc);
    std::allocator<char>::~allocator(&local_31b);
    std::allocator<char>::~allocator(&local_31a);
    std::allocator<char>::~allocator(&local_319);
    in_stack_fffffffffffff9f7 =
         pbrt::ImageChannelDesc::operator_cast_to_bool((ImageChannelDesc *)0x5bf9c3);
    testing::AssertionResult::AssertionResult
              ((AssertionResult *)in_stack_fffffffffffff8b0,
               SUB81((ulong)in_stack_fffffffffffff8a8 >> 0x38,0));
    in_stack_fffffffffffff9f6 = testing::AssertionResult::operator_cast_to_bool(&local_330);
    if (!(bool)in_stack_fffffffffffff9f6) {
      testing::Message::Message
                ((Message *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)in_stack_fffffffffffff928,
                 (char *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
                 (char *)CONCAT17(in_stack_fffffffffffff91f,in_stack_fffffffffffff918),
                 in_stack_fffffffffffff910);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),
                 (Type)((ulong)in_stack_fffffffffffff8d8 >> 0x20),(char *)in_stack_fffffffffffff8d0,
                 (int)in_stack_fffffffffffff8cc,(char *)in_stack_fffffffffffff8c0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                 (Message *)in_stack_fffffffffffff928);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8b0);
      std::__cxx11::string::~string(local_360);
      testing::Message::~Message((Message *)0x5bfc2b);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x5bfca6);
    for (local_364 = 0; iVar7 = local_364,
        in_stack_fffffffffffff9c0 =
             (ColorEncodingHandle *)pbrt::Tuple2<pbrt::Point2,_int>::operator[](local_10,1),
        iVar7 < (int)(in_stack_fffffffffffff9c0->
                     super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                     ).bits; local_364 = local_364 + 1) {
      local_368 = 0;
      while (iVar7 = local_368, piVar3 = pbrt::Tuple2<pbrt::Point2,_int>::operator[](local_10,0),
            iVar7 < *piVar3) {
        pbrt::Point2<int>::Point2
                  ((Point2<int> *)in_stack_fffffffffffff8b0,
                   (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20),(int)in_stack_fffffffffffff8a8);
        pbrt::WrapMode2D::WrapMode2D(in_stack_fffffffffffff8c0,in_stack_fffffffffffff8bc);
        p_01.super_Tuple2<pbrt::Point2,_int>.y = iVar7;
        p_01.super_Tuple2<pbrt::Point2,_int>.x = in_stack_fffffffffffff9a8;
        pbrt::Image::GetChannels
                  ((Image *)CONCAT17(in_stack_fffffffffffff99f,in_stack_fffffffffffff998),p_01,
                   (WrapMode2D)in_stack_fffffffffffff9a0.values);
        local_3bc = 3;
        in_stack_fffffffffffff9a0.values =
             (WrapMode  [2])
             pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::size
                       (&local_398);
        local_3c8 = in_stack_fffffffffffff9a0.values;
        testing::internal::EqHelper<false>::Compare<int,unsigned_long>
                  ((char *)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8),
                   (char *)in_stack_fffffffffffff8c0,
                   (int *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8),
                   (unsigned_long *)in_stack_fffffffffffff8b0);
        in_stack_fffffffffffff99f = testing::AssertionResult::operator_cast_to_bool(local_3b8);
        if (!(bool)in_stack_fffffffffffff99f) {
          testing::Message::Message
                    ((Message *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
          in_stack_fffffffffffff990 =
               testing::AssertionResult::failure_message((AssertionResult *)0x5bfe7a);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),
                     (Type)((ulong)in_stack_fffffffffffff8d8 >> 0x20),
                     (char *)in_stack_fffffffffffff8d0,(int)in_stack_fffffffffffff8cc,
                     (char *)in_stack_fffffffffffff8c0);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                     (Message *)in_stack_fffffffffffff928);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8b0);
          testing::Message::~Message((Message *)0x5bfedd);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x5bff35);
        pbrt::Point2<int>::Point2
                  ((Point2<int> *)in_stack_fffffffffffff8b0,
                   (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20),(int)in_stack_fffffffffffff8a8);
        pbrt::WrapMode2D::WrapMode2D(in_stack_fffffffffffff8c0,in_stack_fffffffffffff8bc);
        pbrt::Image::GetChannels
                  (this_00,(Point2i)p_02,(ImageChannelDesc *)desc,(WrapMode2D)wrapMode_00.values);
        in_stack_fffffffffffff988 =
             (Image *)pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                      operator[]((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                  *)in_stack_fffffffffffff8b0,(size_type)in_stack_fffffffffffff8a8);
        pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                  ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                   in_stack_fffffffffffff8b0,(size_type)in_stack_fffffffffffff8a8);
        testing::internal::EqHelper<false>::Compare<float,float>
                  ((char *)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8),
                   (char *)in_stack_fffffffffffff8c0,
                   (float *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8),
                   (float *)in_stack_fffffffffffff8b0);
        uVar1 = testing::AssertionResult::operator_cast_to_bool(local_428);
        if (!(bool)uVar1) {
          testing::Message::Message
                    ((Message *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
          in_stack_fffffffffffff970 =
               testing::AssertionResult::failure_message((AssertionResult *)0x5c0081);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),
                     (Type)((ulong)in_stack_fffffffffffff8d8 >> 0x20),
                     (char *)in_stack_fffffffffffff8d0,(int)in_stack_fffffffffffff8cc,
                     (char *)in_stack_fffffffffffff8c0);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                     (Message *)in_stack_fffffffffffff928);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8b0);
          testing::Message::~Message((Message *)0x5c00e4);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x5c013c);
        val1 = pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                         ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                          in_stack_fffffffffffff8b0,(size_type)in_stack_fffffffffffff8a8);
        val2 = pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                         ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                          in_stack_fffffffffffff8b0,(size_type)in_stack_fffffffffffff8a8);
        testing::internal::EqHelper<false>::Compare<float,float>
                  ((char *)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8),
                   (char *)in_stack_fffffffffffff8c0,
                   (float *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8),
                   (float *)in_stack_fffffffffffff8b0);
        bVar2 = testing::AssertionResult::operator_cast_to_bool(local_448);
        if (!bVar2) {
          testing::Message::Message
                    ((Message *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
          testing::AssertionResult::failure_message((AssertionResult *)0x5c0210);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),
                     (Type)((ulong)in_stack_fffffffffffff8d8 >> 0x20),
                     (char *)in_stack_fffffffffffff8d0,(int)in_stack_fffffffffffff8cc,
                     (char *)in_stack_fffffffffffff8c0);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                     (Message *)in_stack_fffffffffffff928);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8b0);
          testing::Message::~Message((Message *)0x5c0273);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x5c02cb);
        pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                  ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                   in_stack_fffffffffffff8b0,(size_type)in_stack_fffffffffffff8a8);
        pvVar4 = pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                           ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                            in_stack_fffffffffffff8b0,(size_type)in_stack_fffffffffffff8a8);
        iVar7 = (int)pvVar4;
        testing::internal::EqHelper<false>::Compare<float,float>
                  ((char *)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8),
                   (char *)in_stack_fffffffffffff8c0,
                   (float *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8),
                   (float *)in_stack_fffffffffffff8b0);
        bVar2 = testing::AssertionResult::operator_cast_to_bool(local_468);
        in_stack_fffffffffffff93c = CONCAT13(bVar2,(int3)in_stack_fffffffffffff93c);
        if (!bVar2) {
          testing::Message::Message
                    ((Message *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
          pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x5c039e);
          in_stack_fffffffffffff930 = (int)pcVar5;
          in_stack_fffffffffffff934 = (WrapMode)((ulong)pcVar5 >> 0x20);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),
                     (Type)((ulong)in_stack_fffffffffffff8d8 >> 0x20),
                     (char *)in_stack_fffffffffffff8d0,(int)in_stack_fffffffffffff8cc,
                     (char *)in_stack_fffffffffffff8c0);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                     (Message *)in_stack_fffffffffffff928);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8b0);
          testing::Message::~Message((Message *)0x5c0401);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x5c0459);
        for (local_47c = 0; local_47c < 3; local_47c = local_47c + 1) {
          in_stack_fffffffffffff928 =
               (Image *)pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                        operator[]((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                    *)in_stack_fffffffffffff8b0,(size_type)in_stack_fffffffffffff8a8
                                  );
          pbrt::Point2<int>::Point2
                    ((Point2<int> *)in_stack_fffffffffffff8b0,
                     (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20),(int)in_stack_fffffffffffff8a8)
          ;
          in_stack_fffffffffffff924 = local_47c;
          pbrt::WrapMode2D::WrapMode2D(in_stack_fffffffffffff8c0,in_stack_fffffffffffff8bc);
          p_00.super_Tuple2<pbrt::Point2,_int>.y = iVar7;
          p_00.super_Tuple2<pbrt::Point2,_int>.x = in_stack_fffffffffffff93c;
          wrapMode.wrap.values[1] = in_stack_fffffffffffff938;
          wrapMode.wrap.values[0] = in_stack_fffffffffffff934;
          in_stack_fffffffffffff920 =
               pbrt::Image::GetChannel
                         (in_stack_fffffffffffff928,p_00,in_stack_fffffffffffff924,wrapMode);
          local_494 = in_stack_fffffffffffff920;
          testing::internal::EqHelper<false>::Compare<float,float>
                    ((char *)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8),
                     (char *)in_stack_fffffffffffff8c0,
                     (float *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8),
                     (float *)in_stack_fffffffffffff8b0);
          in_stack_fffffffffffff91f = testing::AssertionResult::operator_cast_to_bool(&local_490);
          if (!(bool)in_stack_fffffffffffff91f) {
            testing::Message::Message
                      ((Message *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
            in_stack_fffffffffffff910 =
                 testing::AssertionResult::failure_message((AssertionResult *)0x5c059b);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0)
                       ,(Type)((ulong)in_stack_fffffffffffff8d8 >> 0x20),
                       (char *)in_stack_fffffffffffff8d0,(int)in_stack_fffffffffffff8cc,
                       (char *)in_stack_fffffffffffff8c0);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930)
                       ,(Message *)in_stack_fffffffffffff928);
            testing::internal::AssertHelper::~AssertHelper
                      ((AssertHelper *)in_stack_fffffffffffff8b0);
            testing::Message::~Message((Message *)0x5c05f8);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x5c0650);
          iVar6 = local_364 * 3;
          piVar3 = pbrt::Tuple2<pbrt::Point2,_int>::operator[](local_10,0);
          local_4bc = iVar6 * *piVar3 + local_368 * 3 + local_47c;
          if (local_74 == U256) {
            pvVar4 = pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                     operator[]((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *
                                )in_stack_fffffffffffff8b0,(size_type)in_stack_fffffffffffff8a8);
            in_stack_fffffffffffff8ec = *pvVar4;
            in_stack_fffffffffffff8f0 =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                           (&local_30,(long)local_4bc);
            iVar6 = 0;
            in_stack_fffffffffffff8e8 =
                 pbrt::Clamp<float,int,int>(*(float *)in_stack_fffffffffffff8f0,0,1);
            in_stack_fffffffffffff8e4 = in_stack_fffffffffffff8ec - in_stack_fffffffffffff8e8;
            std::abs(iVar6);
            local_4d8 = 0x3b00c24b;
            local_4d4 = in_stack_fffffffffffff8e4;
            testing::internal::CmpHelperLT<float,float>
                      ((char *)CONCAT17(uVar1,in_stack_fffffffffffff978),in_stack_fffffffffffff970,
                       val1,val2);
            bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_4d0);
            in_stack_fffffffffffff8e0 = CONCAT13(bVar2,(int3)in_stack_fffffffffffff8e0);
            if (!bVar2) {
              testing::Message::Message
                        ((Message *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
              in_stack_fffffffffffff8d8 =
                   testing::AssertionResult::failure_message((AssertionResult *)0x5c07d9);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)
                         CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),
                         (Type)((ulong)in_stack_fffffffffffff8d8 >> 0x20),
                         (char *)in_stack_fffffffffffff8d0,(int)in_stack_fffffffffffff8cc,
                         (char *)in_stack_fffffffffffff8c0);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)
                         CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                         (Message *)in_stack_fffffffffffff928);
              testing::internal::AssertHelper::~AssertHelper
                        ((AssertHelper *)in_stack_fffffffffffff8b0);
              testing::Message::~Message((Message *)0x5c0836);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x5c088b);
          }
          else {
            in_stack_fffffffffffff8d0 =
                 pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                           (&local_30,(long)local_4bc);
            in_stack_fffffffffffff8cc =
                 modelQuantization(SUB84(in_stack_fffffffffffff8b0,0),
                                   (PixelFormat)((ulong)in_stack_fffffffffffff8a8 >> 0x20));
            local_4ec = in_stack_fffffffffffff8cc;
            in_stack_fffffffffffff8c0 =
                 (WrapMode2D *)
                 pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                           ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                            in_stack_fffffffffffff8b0,(size_type)in_stack_fffffffffffff8a8);
            testing::internal::EqHelper<false>::Compare<float,float>
                      ((char *)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8),
                       (char *)in_stack_fffffffffffff8c0,
                       (float *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8),
                       (float *)in_stack_fffffffffffff8b0);
            bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_500);
            in_stack_fffffffffffff8bc = CONCAT13(bVar2,(int3)in_stack_fffffffffffff8bc);
            if (!bVar2) {
              testing::Message::Message
                        ((Message *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
              in_stack_fffffffffffff8b0 =
                   (Image *)testing::AssertionResult::failure_message((AssertionResult *)0x5c0987);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)
                         CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),
                         (Type)((ulong)in_stack_fffffffffffff8d8 >> 0x20),
                         (char *)in_stack_fffffffffffff8d0,(int)in_stack_fffffffffffff8cc,
                         (char *)in_stack_fffffffffffff8c0);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)
                         CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                         (Message *)in_stack_fffffffffffff928);
              testing::internal::AssertHelper::~AssertHelper
                        ((AssertHelper *)in_stack_fffffffffffff8b0);
              testing::Message::~Message((Message *)0x5c09e4);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x5c0a39);
          }
        }
        pbrt::ImageChannelValues::~ImageChannelValues((ImageChannelValues *)0x5c0a6f);
        pbrt::ImageChannelValues::~ImageChannelValues((ImageChannelValues *)0x5c0a7c);
        local_368 = local_368 + 1;
      }
    }
    pbrt::ImageChannelDesc::~ImageChannelDesc((ImageChannelDesc *)0x5c0ad3);
    pbrt::Image::~Image(in_stack_fffffffffffff8b0);
  }
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
            ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)in_stack_fffffffffffff8b0);
  return;
}

Assistant:

TEST(Image, GetSetBGR) {
    Point2i res(7, 32);
    pstd::vector<float> rgbPixels = GetFloatPixels(res, 3);

    for (auto format : {PixelFormat::U256, PixelFormat::Half, PixelFormat::Float}) {
        Image image(format, res, {"R", "G", "B"}, ColorEncodingHandle::Linear);
        for (int y = 0; y < res[1]; ++y)
            for (int x = 0; x < res[0]; ++x)
                for (int c = 0; c < 3; ++c)
                    image.SetChannel({x, y}, c, rgbPixels[3 * y * res[0] + 3 * x + c]);

        ImageChannelDesc bgrDesc = image.GetChannelDesc({"B", "G", "R"});
        EXPECT_TRUE(bool(bgrDesc));

        for (int y = 0; y < res[1]; ++y)
            for (int x = 0; x < res[0]; ++x) {
                ImageChannelValues rgb = image.GetChannels({x, y});
                EXPECT_EQ(3, rgb.size());

                ImageChannelValues bgr = image.GetChannels({x, y}, bgrDesc);
                EXPECT_EQ(rgb[0], bgr[2]);
                EXPECT_EQ(rgb[1], bgr[1]);
                EXPECT_EQ(rgb[2], bgr[0]);

                for (int c = 0; c < 3; ++c) {
                    EXPECT_EQ(rgb[c], image.GetChannel({x, y}, c));
                    int offset = 3 * y * res[0] + 3 * x + c;
                    if (format == PixelFormat::U256)
                        EXPECT_LT(std::abs(rgb[c] - Clamp(rgbPixels[offset], 0, 1)),
                                  0.501f / 255.f);
                    else {
                        Float qv = modelQuantization(rgbPixels[offset], format);
                        EXPECT_EQ(rgb[c], qv);
                    }
                }
            }
    }
}